

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.cpp
# Opt level: O2

void SignalHandler(int signal,siginfo_t *sigInfo,void *context)

{
  uint uVar1;
  ostream *poVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  
  if ((sigInfo->_sifields)._pad[2] != 0x42424242) {
    pthread_mutex_lock((pthread_mutex_t *)&gHandlerLock);
    if ((char)in_FS_OFFSET[-1] == '\x01') {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Oops! Something went wrong in the simulation library");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Exception ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,signal);
    poVar2 = std::operator<<(poVar2," occured at ");
    poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = backtrace(gBuffer,0x100);
    uVar3 = 0;
    if (uVar1 == 0) {
      uVar4 = 0;
    }
    else {
      sigInfo = (siginfo_t *)backtrace_symbols(gBuffer,uVar1);
      uVar4 = 0;
      if (sigInfo != (siginfo_t *)0x0) {
        uVar4 = uVar1;
      }
    }
    uVar5 = 0;
    if (0 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
    }
    for (; uVar4 = uVar4 - 1, uVar5 != uVar3; uVar3 = uVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar4);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,*(char **)(&sigInfo->si_signo + uVar3 * 2));
      std::operator<<(poVar2,"\n");
    }
    pthread_mutex_unlock((pthread_mutex_t *)&gHandlerLock);
    free(sigInfo);
  }
  if ((char)in_FS_OFFSET[-1] == '\x01') {
    longjmp((__jmp_buf_tag *)(*in_FS_OFFSET + -0xd0),signal);
  }
  return;
}

Assistant:

void SignalHandler(int signal, siginfo_t * sigInfo, void * context)
{
    UNUSED_PARAMETER(context);

    /* If the signal wasn't sent on purpose by ourselves, then, it indicates
     * a broken behavior in either HPCsim or the called simulation.
     * We'll have to provide a backtrace to help debugging.
     */
    if (sigInfo->si_int != HPCSIM_MAGIC_MARKER)
    {
        char ** strings;
        int numberAddresses, trace;

        /* Lock the handler lock for two reasons:
         * First, we don't want to have a race condition accessing standard error
         * Our backtrace must be crystal clear
         * Second, the gBuffer is shared between all the instances of the handler
         * so, make sure it is only used by one at a time
         */
        pthread_mutex_lock(&gHandlerLock);

        /* If the signal occured while in a try block, it is the simulation shared object
         * which is failing. Inform the user
         */
        if (gInTry)
        {
            std::cerr << "Oops! Something went wrong in the simulation library" << std::endl;
        }
        std::cerr << "Exception " << signal << " occured at " << sigInfo->si_addr << std::endl;

        /* Get the backtrace which lead to the error */
        numberAddresses = backtrace(gBuffer, BUFFER_SIZE);
        if (numberAddresses != 0)
        {
            /* Try to resolve symbols */
            strings = backtrace_symbols(gBuffer, numberAddresses);
            if (strings == 0)
            {
                numberAddresses = 0;
            }
        }

        /* Print the backtrace */
        for (trace = 0; trace < numberAddresses; ++trace)
        {
            std::cerr << (numberAddresses - 1 - trace) << ": " << strings[trace] << "\n";
        }

        /* No need for the lock any longer */
        pthread_mutex_unlock(&gHandlerLock);

        free(strings);
    }

    /* If we were in a try block, jump to the exception handler */
    if (gInTry)
    {
        longjmp(gJumpEnv, signal);
    }
}